

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inversion.hpp
# Opt level: O3

RealType __thiscall OpenMD::Inversion::getValue(Inversion *this,int snapshotNo)

{
  undefined4 *puVar1;
  double *pdVar2;
  Atom *pAVar3;
  SnapshotManager *pSVar4;
  double dVar5;
  uint i;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar8;
  undefined4 uVar9;
  double tmp;
  undefined4 uVar10;
  double dVar11;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  Vector3<double> result_4;
  Vector<double,_3U> result_1;
  double local_138 [4];
  Vector3d local_118;
  double local_f8 [4];
  Vector3d local_d8;
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  Vector3d local_98;
  double local_78 [4];
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  
  pAVar3 = (this->super_ShortRangeInteraction).atoms_.
           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
           super__Vector_impl_data._M_start[1];
  iVar6 = (*((pAVar3->super_StuntDouble).snapshotMan_)->_vptr_SnapshotManager[4])();
  lVar8 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar7 = *(long *)(CONCAT44(extraout_var,iVar6) + (pAVar3->super_StuntDouble).storage_);
  puVar1 = (undefined4 *)(lVar7 + lVar8 * 0x18);
  local_38._0_4_ = *puVar1;
  local_38._4_4_ = puVar1[1];
  uStack_30 = puVar1[2];
  uStack_2c = puVar1[3];
  local_28 = *(undefined8 *)(lVar7 + 0x10 + lVar8 * 0x18);
  pAVar3 = (this->super_ShortRangeInteraction).atoms_.
           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
           super__Vector_impl_data._M_start[2];
  pSVar4 = (pAVar3->super_StuntDouble).snapshotMan_;
  iVar6 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  lVar8 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar7 = *(long *)(CONCAT44(extraout_var_00,iVar6) + (pAVar3->super_StuntDouble).storage_);
  puVar1 = (undefined4 *)(lVar7 + lVar8 * 0x18);
  local_58._0_4_ = *puVar1;
  local_58._4_4_ = puVar1[1];
  uStack_50 = puVar1[2];
  uStack_4c = puVar1[3];
  local_48 = *(undefined8 *)(lVar7 + 0x10 + lVar8 * 0x18);
  pAVar3 = *(this->super_ShortRangeInteraction).atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar4 = (pAVar3->super_StuntDouble).snapshotMan_;
  iVar6 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  lVar8 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar7 = *(long *)(CONCAT44(extraout_var_01,iVar6) + (pAVar3->super_StuntDouble).storage_);
  puVar1 = (undefined4 *)(lVar7 + lVar8 * 0x18);
  local_b8._0_4_ = *puVar1;
  local_b8._4_4_ = puVar1[1];
  uStack_b0 = puVar1[2];
  uStack_ac = puVar1[3];
  local_a8 = *(undefined8 *)(lVar7 + 0x10 + lVar8 * 0x18);
  pAVar3 = (this->super_ShortRangeInteraction).atoms_.
           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
           super__Vector_impl_data._M_start[3];
  pSVar4 = (pAVar3->super_StuntDouble).snapshotMan_;
  iVar6 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  lVar8 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar7 = *(long *)(CONCAT44(extraout_var_02,iVar6) + (pAVar3->super_StuntDouble).storage_);
  pdVar2 = (double *)(lVar7 + lVar8 * 0x18);
  local_78[0] = *pdVar2;
  local_78[1] = pdVar2[1];
  local_78[2] = (double)*(undefined8 *)(lVar7 + 0x10 + lVar8 * 0x18);
  local_118.super_Vector<double,_3U>.data_[0] = 0.0;
  local_118.super_Vector<double,_3U>.data_[1] = 0.0;
  local_118.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar7 = 0;
  do {
    local_118.super_Vector<double,_3U>.data_[lVar7] =
         (double)(&local_38)[lVar7] - (double)(&local_b8)[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_98.super_Vector<double,_3U>.data_[2] = local_118.super_Vector<double,_3U>.data_[2];
  local_98.super_Vector<double,_3U>.data_[0]._0_4_ =
       local_118.super_Vector<double,_3U>.data_[0]._0_4_;
  local_98.super_Vector<double,_3U>.data_[0]._4_4_ =
       local_118.super_Vector<double,_3U>.data_[0]._4_4_;
  local_98.super_Vector<double,_3U>.data_[1]._0_4_ =
       local_118.super_Vector<double,_3U>.data_[1]._0_4_;
  local_98.super_Vector<double,_3U>.data_[1]._4_4_ =
       local_118.super_Vector<double,_3U>.data_[1]._4_4_;
  pSVar4 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar6 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_03,iVar6),&local_98);
  local_d8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_d8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_d8.super_Vector<double,_3U>.data_[2] = 0.0;
  lVar7 = 0;
  do {
    local_d8.super_Vector<double,_3U>.data_[lVar7] =
         (double)(&local_b8)[lVar7] - (double)(&local_58)[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_118.super_Vector<double,_3U>.data_[2] = local_d8.super_Vector<double,_3U>.data_[2];
  local_118.super_Vector<double,_3U>.data_[0] = local_d8.super_Vector<double,_3U>.data_[0];
  local_118.super_Vector<double,_3U>.data_[1] = local_d8.super_Vector<double,_3U>.data_[1];
  pSVar4 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar6 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_04,iVar6),&local_118);
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  lVar7 = 0;
  do {
    local_138[lVar7] = (double)(&local_b8)[lVar7] - local_78[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_d8.super_Vector<double,_3U>.data_[2] = local_138[2];
  local_d8.super_Vector<double,_3U>.data_[0] = local_138[0];
  local_d8.super_Vector<double,_3U>.data_[1] = local_138[1];
  pSVar4 = (this->super_ShortRangeInteraction).snapshotMan_;
  iVar6 = (*pSVar4->_vptr_SnapshotManager[4])(pSVar4,snapshotNo);
  Snapshot::wrapVector((Snapshot *)CONCAT44(extraout_var_05,iVar6),&local_d8);
  local_138[0] = (double)CONCAT44(local_98.super_Vector<double,_3U>.data_[1]._4_4_,
                                  local_98.super_Vector<double,_3U>.data_[1]._0_4_) *
                 local_d8.super_Vector<double,_3U>.data_[2] -
                 local_98.super_Vector<double,_3U>.data_[2] *
                 local_d8.super_Vector<double,_3U>.data_[1];
  local_138[1] = local_98.super_Vector<double,_3U>.data_[2] *
                 local_d8.super_Vector<double,_3U>.data_[0] -
                 (double)CONCAT44(local_98.super_Vector<double,_3U>.data_[0]._4_4_,
                                  local_98.super_Vector<double,_3U>.data_[0]._0_4_) *
                 local_d8.super_Vector<double,_3U>.data_[2];
  local_138[2] = (double)CONCAT44(local_98.super_Vector<double,_3U>.data_[0]._4_4_,
                                  local_98.super_Vector<double,_3U>.data_[0]._0_4_) *
                 local_d8.super_Vector<double,_3U>.data_[1] -
                 local_d8.super_Vector<double,_3U>.data_[0] *
                 (double)CONCAT44(local_98.super_Vector<double,_3U>.data_[1]._4_4_,
                                  local_98.super_Vector<double,_3U>.data_[1]._0_4_);
  local_f8[0] = local_118.super_Vector<double,_3U>.data_[2] *
                local_d8.super_Vector<double,_3U>.data_[1] -
                local_d8.super_Vector<double,_3U>.data_[2] *
                local_118.super_Vector<double,_3U>.data_[1];
  local_f8[1] = local_118.super_Vector<double,_3U>.data_[0] *
                local_d8.super_Vector<double,_3U>.data_[2] -
                local_d8.super_Vector<double,_3U>.data_[0] *
                local_118.super_Vector<double,_3U>.data_[2];
  local_f8[2] = local_d8.super_Vector<double,_3U>.data_[0] *
                local_118.super_Vector<double,_3U>.data_[1] -
                local_118.super_Vector<double,_3U>.data_[0] *
                local_d8.super_Vector<double,_3U>.data_[1];
  dVar5 = 0.0;
  lVar7 = 0;
  do {
    dVar5 = dVar5 + local_138[lVar7] * local_138[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  lVar7 = 0;
  do {
    local_138[lVar7] = local_138[lVar7] / dVar5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar5 = 0.0;
  lVar7 = 0;
  do {
    dVar5 = dVar5 + local_f8[lVar7] * local_f8[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  lVar7 = 0;
  do {
    local_f8[lVar7] = local_f8[lVar7] / dVar5;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar5 = 0.0;
  lVar7 = 0;
  do {
    dVar5 = dVar5 + local_138[lVar7] * local_f8[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  dVar11 = 1.0;
  if (dVar5 <= 1.0) {
    dVar11 = dVar5;
  }
  uVar9 = 0;
  uVar10 = 0xbff00000;
  if (-1.0 <= dVar11) {
    uVar9 = SUB84(dVar11,0);
    uVar10 = (undefined4)((ulong)dVar11 >> 0x20);
  }
  dVar5 = acos((double)CONCAT44(uVar10,uVar9));
  return dVar5;
}

Assistant:

RealType getValue(int snapshotNo) {
      // In OpenMD's version of an inversion, the central atom
      // comes first.  However, to get the planarity in a typical cosine
      // version of this potential (i.e. Amber-style), the central atom
      // is treated as atom *3* in a standard torsion form:

      Vector3d pos1 = atoms_[1]->getPos(snapshotNo);
      Vector3d pos2 = atoms_[2]->getPos(snapshotNo);
      Vector3d pos3 = atoms_[0]->getPos(snapshotNo);
      Vector3d pos4 = atoms_[3]->getPos(snapshotNo);

      Vector3d r31 = pos1 - pos3;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r31);
      Vector3d r23 = pos3 - pos2;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r23);
      Vector3d r43 = pos3 - pos4;
      snapshotMan_->getSnapshot(snapshotNo)->wrapVector(r43);

      //  Calculate the cross products and distances
      Vector3d A = cross(r31, r43);
      Vector3d B = cross(r43, r23);

      A.normalize();
      B.normalize();

      //  Calculate the sin and cos
      RealType cos_phi = dot(A, B);
      if (cos_phi > 1.0) cos_phi = 1.0;
      if (cos_phi < -1.0) cos_phi = -1.0;
      return acos(cos_phi);
    }